

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

pair<bool,_bool> __thiscall
kratos::Generator::correct_wire_direction
          (Generator *this,shared_ptr<kratos::Var> *var1,shared_ptr<kratos::Var> *var2)

{
  VarType VVar1;
  VarType VVar2;
  element_type *peVar3;
  element_type *peVar4;
  Generator *pGVar5;
  pair<bool,_bool> pVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  IRNode *pIVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  iterator iVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Port *port1;
  Port *port2;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  UserException *this_00;
  VarException *pVVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  InterfacePort *port_i_1;
  InterfacePort *port_i;
  ushort uVar13;
  bool bVar14;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  string local_c8;
  size_type local_a8;
  undefined8 uStack_a0;
  IRNode *local_88;
  shared_ptr<kratos::Var> *local_80;
  string local_78;
  pointer local_58;
  size_type sStack_50;
  Generator *local_40;
  allocator_type local_31;
  
  peVar3 = (var1->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40 = this;
  if ((peVar3 == (element_type *)0x0) ||
     (peVar4 = (var2->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     peVar4 == (element_type *)0x0)) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Variable cannot be null (None)","");
    UserException::UserException(this_00,&local_78);
    __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  VVar1 = peVar3->type_;
  local_80 = var1;
  while (VVar1 == Slice) {
    lVar9 = __dynamic_cast(peVar3,&Var::typeinfo,&VarSlice::typeinfo,0);
    peVar3 = *(element_type **)(lVar9 + 0x270);
    VVar1 = peVar3->type_;
  }
  VVar2 = peVar4->type_;
  while (VVar2 == Slice) {
    lVar9 = __dynamic_cast(peVar4,&Var::typeinfo,&VarSlice::typeinfo,0);
    peVar4 = *(element_type **)(lVar9 + 0x270);
    VVar2 = peVar4->type_;
  }
  uVar13 = 0x100;
  if ((VVar1 == PortIO) || (pVar6.first = true, pVar6.second = false, VVar2 == PortIO)) {
    if ((VVar1 == PortIO) && (VVar2 != PortIO)) {
      pIVar10 = (IRNode *)__dynamic_cast(peVar3,&Var::typeinfo,&Port::typeinfo,0);
      iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
      pGVar5 = local_40;
      if ((Generator *)CONCAT44(extraout_var,iVar7) == local_40) {
        iVar7 = (*pIVar10->_vptr_IRNode[0x1d])(pIVar10);
        iVar8 = 1;
        if (((char)iVar7 != '\0') &&
           (((char)pIVar10[6].fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[3].first._M_string_length != '\x01' ||
            (iVar7 = (*(peVar4->super_IRNode)._vptr_IRNode[0xd])(peVar4),
            (Generator *)CONCAT44(extraout_var_03,iVar7) != pGVar5)))) {
          iVar8 = 0;
        }
        bVar14 = *(int *)&pIVar10[6]._vptr_IRNode == iVar8;
      }
      else {
        iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   (CONCAT44(extraout_var_00,iVar7) + 0x68));
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->children_)._M_h,(key_type *)(local_78._M_dataplus._M_p + 0x98));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
          iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
          (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x1f])(&local_a8);
          local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_05,iVar7) + 0x78);
          local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_05,iVar7) + 0x80);
          local_58 = (local_40->name)._M_dataplus._M_p;
          sStack_50 = (local_40->name)._M_string_length;
          local_78.field_2._M_allocated_capacity = local_a8;
          local_78.field_2._8_8_ = uStack_a0;
          format_str.size_ = 0xddd;
          format_str.data_ = (char *)0x1a;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_c8,(detail *)"{0}.{1} is not part of {2}",format_str,args);
          __l._M_len = 1;
          __l._M_array = &local_88;
          local_88 = pIVar10;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78,__l,&local_31);
          VarException::VarException
                    (pVVar12,&local_c8,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78);
          __cxa_throw(pVVar12,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar14 = *(int *)&pIVar10[6]._vptr_IRNode == 0;
      }
    }
    else {
      if ((VVar1 == PortIO) || (VVar2 != PortIO)) {
        port1 = (Port *)__dynamic_cast(peVar3,&Var::typeinfo,&Port::typeinfo,0);
        port2 = (Port *)__dynamic_cast(peVar4,&Var::typeinfo,&Port::typeinfo,0);
        pVar6 = correct_port_direction(port1,port2,local_40);
        uVar13 = (ushort)pVar6 & 0xff00;
        goto LAB_0016aa6d;
      }
      pIVar10 = (IRNode *)__dynamic_cast(peVar4,&Var::typeinfo,&Port::typeinfo,0);
      iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
      pGVar5 = local_40;
      if ((Generator *)CONCAT44(extraout_var_01,iVar7) == local_40) {
        iVar8 = (*pIVar10->_vptr_IRNode[0x1d])(pIVar10);
        iVar7 = 0;
        if (((char)iVar8 != '\0') &&
           (((char)pIVar10[6].fn_name_ln.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[3].first._M_string_length != '\x01' ||
            (iVar8 = (*(peVar3->super_IRNode)._vptr_IRNode[0xd])(peVar3), iVar7 = 0,
            (Generator *)CONCAT44(extraout_var_04,iVar8) != pGVar5)))) {
          iVar7 = 1;
        }
        bVar14 = *(int *)&pIVar10[6]._vptr_IRNode == iVar7;
      }
      else {
        iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   (CONCAT44(extraout_var_02,iVar7) + 0x68));
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(pGVar5->children_)._M_h,(key_type *)(local_78._M_dataplus._M_p + 0x98));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
        }
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Generator>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pVVar12 = (VarException *)__cxa_allocate_exception(0x10);
          iVar7 = (*pIVar10->_vptr_IRNode[0xd])(pIVar10);
          (*(((local_80->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_IRNode)._vptr_IRNode[0x1f])(&local_a8);
          local_78._M_dataplus._M_p = *(pointer *)(CONCAT44(extraout_var_06,iVar7) + 0x78);
          local_78._M_string_length = *(size_type *)(CONCAT44(extraout_var_06,iVar7) + 0x80);
          local_58 = (local_40->name)._M_dataplus._M_p;
          sStack_50 = (local_40->name)._M_string_length;
          local_78.field_2._M_allocated_capacity = local_a8;
          local_78.field_2._8_8_ = uStack_a0;
          format_str_00.size_ = 0xddd;
          format_str_00.data_ = (char *)0x1a;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args_00.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)&local_78;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_c8,(detail *)"{0}.{1} is not part of {2}",format_str_00,args_00);
          __l_00._M_len = 1;
          __l_00._M_array = &local_88;
          local_88 = pIVar10;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78,__l_00,&local_31);
          VarException::VarException
                    (pVVar12,&local_c8,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     &local_78);
          __cxa_throw(pVVar12,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar14 = *(int *)&pIVar10[6]._vptr_IRNode == 1;
      }
    }
    pVar6.second = false;
    pVar6.first = bVar14;
  }
LAB_0016aa6d:
  return (pair<bool,_bool>)(uVar13 | (ushort)pVar6 & 0xff);
}

Assistant:

std::pair<bool, bool> Generator::correct_wire_direction(const std::shared_ptr<Var> &var1,
                                                        const std::shared_ptr<Var> &var2) {
    if (!var1 || !var2) throw UserException("Variable cannot be null (None)");
    Var *root1 = var1.get();
    while (root1->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root1);
        root1 = var->parent_var;
    }
    Var *root2 = var2.get();
    while (root2->type() == VarType::Slice) {
        auto *var = dynamic_cast<VarSlice *>(root2);
        root2 = var->parent_var;
    }
    if (root1->type() != VarType::PortIO && root2->type() != VarType::PortIO) {
        // there is nothing we can do
        return {true, true};
    } else if (root1->type() == VarType::PortIO && root2->type() != VarType::PortIO) {
        // var1 is port and var2 is not
        auto *port1 = dynamic_cast<Port *>(root1);
        if (port1->generator() == this) {
            bool flip_dir = false;
            if (port1->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port1);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root2->generator() == this);
            }
            return {!flip_dir ? port1->port_direction() == PortDirection::Out
                              : port1->port_direction() == PortDirection::In,
                    true};
        } else {
            if (!has_child_generator(port1->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port1->generator()->name,
                                            var1->to_string(), name),
                                   {port1});
            }
            // child generator, reverse order
            return {port1->port_direction() == PortDirection::In, true};
        }
    } else if (root2->type() == VarType::PortIO && root1->type() != VarType::PortIO) {
        // var2 is port and var1 is not
        auto *port2 = dynamic_cast<Port *>(root2);
        if (port2->generator() == this) {
            bool flip_dir = false;
            if (port2->is_interface()) {
                auto *port_i = reinterpret_cast<InterfacePort *>(port2);
                const auto *ref = port_i->interface();
                flip_dir = !(ref->is_port() && root1->generator() == this);
            }
            return {!flip_dir ? port2->port_direction() == PortDirection::In
                              : port2->port_direction() == PortDirection::Out,
                    true};
        } else {
            if (!has_child_generator(port2->generator()->shared_from_this())) {
                throw VarException(::format("{0}.{1} is not part of {2}", port2->generator()->name,
                                            var1->to_string(), name),
                                   {port2});
            }
            // child generator, reverse order
            return {port2->port_direction() == PortDirection::Out, true};
        }
    } else {
        // both are ports
        auto *port1 = dynamic_cast<Port *>(root1);
        auto *port2 = dynamic_cast<Port *>(root2);
        return correct_port_direction(port1, port2, this);
    }
}